

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O2

bool __thiscall
Js::JavascriptFunction::GetSourceStringName(JavascriptFunction *this,JavascriptString **name)

{
  ScriptContext *this_00;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int32 propertyId;
  undefined4 *puVar4;
  undefined4 extraout_var;
  PropertyString *pPVar5;
  Var aValue;
  
  if (name == (JavascriptString **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                ,0xcb7,"(name != nullptr)","name != nullptr");
    if (!bVar2) goto LAB_00a8c35b;
    *puVar4 = 0;
  }
  this_00 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr
             )->super_JavascriptLibraryBase).scriptContext.ptr;
  iVar3 = (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6c])(this);
  aValue = (Var)CONCAT44(extraout_var,iVar3);
  if (aValue != (Var)0x0) {
    bVar2 = TaggedInt::Is(aValue);
    if (bVar2) {
      propertyId = TaggedInt::ToInt32(aValue);
      pPVar5 = ScriptContext::GetPropertyString(this_00,propertyId);
    }
    else {
      bVar2 = VarIs<Js::JavascriptString>(aValue);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                    ,0xcc3,"(VarIs<JavascriptString>(sourceString))",
                                    "VarIs<JavascriptString>(sourceString)");
        if (!bVar2) {
LAB_00a8c35b:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      pPVar5 = (PropertyString *)VarTo<Js::JavascriptString>(aValue);
    }
    *name = &pPVar5->super_JavascriptString;
  }
  return aValue != (Var)0x0;
}

Assistant:

bool JavascriptFunction::GetSourceStringName(JavascriptString** name) const
    {
        Assert(name != nullptr);
        ScriptContext* scriptContext = this->GetScriptContext();
        Var sourceString = this->GetSourceString();

        if (sourceString)
        {
            if (TaggedInt::Is(sourceString))
            {
                int32 propertyIdOfSourceString = TaggedInt::ToInt32(sourceString);
                *name = scriptContext->GetPropertyString(propertyIdOfSourceString);
                return true;
            }
            Assert(VarIs<JavascriptString>(sourceString));
            *name = VarTo<JavascriptString>(sourceString);
            return true;
        }
        return false;
    }